

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::ftran(Base *this,DVector *vec)

{
  bool bVar1;
  long in_RDI;
  size_t i;
  DVector w;
  ETM *etm;
  const_iterator __end1;
  const_iterator __begin1;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *__range1;
  DVector *in_stack_ffffffffffffff78;
  DVector *in_stack_ffffffffffffff80;
  type in_stack_ffffffffffffff88;
  DVector *in_stack_ffffffffffffff90;
  DVector *in_stack_ffffffffffffffb0;
  ulong uVar2;
  ETM *in_stack_ffffffffffffffb8;
  Base *in_stack_ffffffffffffffc0;
  __normal_iterator<const_fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ETM *)std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::begin
                        ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)
                         in_stack_ffffffffffffff78);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::end
            ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
    ::operator*(local_20);
    apply_etm(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    __gnu_cxx::
    __normal_iterator<const_fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
    ::operator++(local_20);
  }
  DVector::DVector(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  for (uVar2 = 0; uVar2 < *(ulong *)(in_RDI + 0x30); uVar2 = uVar2 + 1) {
    in_stack_ffffffffffffff90 =
         (DVector *)DVector::operator[](in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88)
    ;
    in_stack_ffffffffffffff80 = (DVector *)(in_stack_ffffffffffffff90->vals)._M_size;
    in_stack_ffffffffffffff88 =
         std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                   ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                    in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 =
         (DVector *)DVector::operator[](in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88)
    ;
    (in_stack_ffffffffffffff78->vals)._M_size = (size_t)in_stack_ffffffffffffff80;
  }
  DVector::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  DVector::~DVector((DVector *)0x1e4235);
  return;
}

Assistant:

void Base::ftran(DVector &vec) const {
  for (auto &etm : etms)
    apply_etm(etm, vec);

  // Reorder vec according to base column swaps
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[row_ordering[i]] = vec[i];
  vec = w;
}